

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
SummizerTestGlobal1_CanSumGlobal1_Test::TestBody(SummizerTestGlobal1_CanSumGlobal1_Test *this)

{
  unique_ptr<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_> uVar1;
  int iVar2;
  pointer pgVar3;
  TypedExpectation<int_(int)> *pTVar4;
  MatcherBase<int> MStack_48;
  MockSpec<int_(int)> local_30;
  
  if ((__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>)
      gmock_globalmock_sum1_instance._M_t.
      super___uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>._M_t
      .super__Tuple_impl<0UL,_gmock_globalmock_sum1_*,_std::default_delete<gmock_globalmock_sum1>_>.
      super__Head_base<0UL,_gmock_globalmock_sum1_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>)0x0) {
LAB_001119dc:
    pgVar3 = (pointer)operator_new(0x50);
    pgVar3->m_tag = "TestBody";
    testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
              (&(pgVar3->gmock1_sum1_41).super_UntypedFunctionMockerBase);
    (pgVar3->gmock1_sum1_41).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
         (_func_int **)&PTR__FunctionMocker_00191c90;
    std::__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>::reset
              ((__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>
                *)&gmock_globalmock_sum1_instance,pgVar3);
  }
  else {
    iVar2 = strcmp(*(char **)gmock_globalmock_sum1_instance._M_t.
                             super___uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gmock_globalmock_sum1_*,_std::default_delete<gmock_globalmock_sum1>_>
                             .super__Head_base<0UL,_gmock_globalmock_sum1_*,_false>._M_head_impl,
                   "TestBody");
    if (iVar2 != 0) goto LAB_001119dc;
  }
  uVar1._M_t.
  super___uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>._M_t.
  super__Tuple_impl<0UL,_gmock_globalmock_sum1_*,_std::default_delete<gmock_globalmock_sum1>_>.
  super__Head_base<0UL,_gmock_globalmock_sum1_*,_false>._M_head_impl =
       gmock_globalmock_sum1_instance._M_t.
       super___uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>.
       _M_t.
       super__Tuple_impl<0UL,_gmock_globalmock_sum1_*,_std::default_delete<gmock_globalmock_sum1>_>.
       super__Head_base<0UL,_gmock_globalmock_sum1_*,_false>._M_head_impl;
  testing::Matcher<int>::Matcher((Matcher<int> *)&MStack_48,1);
  gmock_globalmock_sum1::gmock_sum1
            (&local_30,
             (gmock_globalmock_sum1 *)
             uVar1._M_t.
             super___uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmock_globalmock_sum1_*,_std::default_delete<gmock_globalmock_sum1>_>
             .super__Head_base<0UL,_gmock_globalmock_sum1_*,_false>._M_head_impl,
             (Matcher<int> *)&MStack_48);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<int_(int)>::InternalExpectedAt
                     (&local_30,
                      "/workspace/llm4binary/github/license_c_cmakelists/apriorit[P]gmock-global/sample/main.cpp"
                      ,0x98,"*gmock_globalmock_sum1_instance","sum1(1)");
  testing::internal::TypedExpectation<int_(int)>::Times(pTVar4,1);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_30.matchers_);
  testing::internal::MatcherBase<int>::~MatcherBase(&MStack_48);
  if ((__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>)
      gmock_globalmock_sum1_instance._M_t.
      super___uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>._M_t
      .super__Tuple_impl<0UL,_gmock_globalmock_sum1_*,_std::default_delete<gmock_globalmock_sum1>_>.
      super__Head_base<0UL,_gmock_globalmock_sum1_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>)0x0) {
    iVar2 = strcmp(*(char **)gmock_globalmock_sum1_instance._M_t.
                             super___uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gmock_globalmock_sum1_*,_std::default_delete<gmock_globalmock_sum1>_>
                             .super__Head_base<0UL,_gmock_globalmock_sum1_*,_false>._M_head_impl,
                   "TestBody");
    if (iVar2 == 0) goto LAB_00111ae1;
  }
  pgVar3 = (pointer)operator_new(0x50);
  pgVar3->m_tag = "TestBody";
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(pgVar3->gmock1_sum1_41).super_UntypedFunctionMockerBase);
  (pgVar3->gmock1_sum1_41).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00191c90;
  std::__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>::reset
            ((__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_> *)
             &gmock_globalmock_sum1_instance,pgVar3);
LAB_00111ae1:
  uVar1._M_t.
  super___uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>._M_t.
  super__Tuple_impl<0UL,_gmock_globalmock_sum1_*,_std::default_delete<gmock_globalmock_sum1>_>.
  super__Head_base<0UL,_gmock_globalmock_sum1_*,_false>._M_head_impl =
       gmock_globalmock_sum1_instance._M_t.
       super___uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>.
       _M_t.
       super__Tuple_impl<0UL,_gmock_globalmock_sum1_*,_std::default_delete<gmock_globalmock_sum1>_>.
       super__Head_base<0UL,_gmock_globalmock_sum1_*,_false>._M_head_impl;
  testing::Matcher<int>::Matcher((Matcher<int> *)&MStack_48,2);
  gmock_globalmock_sum1::gmock_sum1
            (&local_30,
             (gmock_globalmock_sum1 *)
             uVar1._M_t.
             super___uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmock_globalmock_sum1_*,_std::default_delete<gmock_globalmock_sum1>_>
             .super__Head_base<0UL,_gmock_globalmock_sum1_*,_false>._M_head_impl,
             (Matcher<int> *)&MStack_48);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<int_(int)>::InternalExpectedAt
                     (&local_30,
                      "/workspace/llm4binary/github/license_c_cmakelists/apriorit[P]gmock-global/sample/main.cpp"
                      ,0x99,"*gmock_globalmock_sum1_instance","sum1(2)");
  testing::internal::TypedExpectation<int_(int)>::Times(pTVar4,1);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_30.matchers_);
  testing::internal::MatcherBase<int>::~MatcherBase(&MStack_48);
  sum1(1);
  sum1(2);
  std::__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>::reset
            ((__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_> *)
             &gmock_globalmock_sum1_instance,(pointer)0x0);
  std::__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_>::reset
            ((__uniq_ptr_impl<gmock_globalmock_sum1,_std::default_delete<gmock_globalmock_sum1>_> *)
             &gmock_globalmock_sum1_instance,(pointer)0x0);
  return;
}

Assistant:

TEST(SummizerTestGlobal1, ExceptionOnCallWithoutExpect)
{
    ASSERT_ANY_THROW(sum1(0));
}